

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O3

TestCaseGroup *
vkt::SpirVAssembly::createOpSRemGraphicsTests(TestContext *testCtx,qpTestResult negFailResult)

{
  qpTestResult *pqVar1;
  qpTestResult failResult;
  bool bVar2;
  mapped_type *pmVar3;
  bool bVar4;
  CaseParams *pCVar5;
  allocator<char> local_1e2;
  allocator<char> local_1e1;
  TestCaseGroup *local_1e0;
  undefined1 local_1d8 [16];
  pointer local_1c8;
  string local_1b8;
  string local_198;
  RGBA outputColors [4];
  RGBA inputColors [4];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  fragments;
  CaseParams cases [2];
  
  local_1e0 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(local_1e0,testCtx,"srem","OpSRem");
  fragments._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &fragments._M_t._M_impl.super__Rb_tree_header._M_header;
  fragments._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  fragments._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  fragments._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pqVar1 = &cases[0].failResult;
  fragments._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       fragments._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  cases[0].name = (char *)pqVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)cases,"pre_main","");
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&fragments,(key_type *)cases);
  std::__cxx11::string::_M_replace((ulong)pmVar3,0,(char *)pmVar3->_M_string_length,0xaf6448);
  if ((qpTestResult *)cases[0].name != pqVar1) {
    operator_delete(cases[0].name,CONCAT44(cases[0].operands[0][0],cases[0].failResult) + 1);
  }
  cases[0].name = (char *)pqVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)cases,"testfun","");
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&fragments,(key_type *)cases);
  std::__cxx11::string::_M_replace((ulong)pmVar3,0,(char *)pmVar3->_M_string_length,0xaf65b3);
  if ((qpTestResult *)cases[0].name != pqVar1) {
    operator_delete(cases[0].name,CONCAT44(cases[0].operands[0][0],cases[0].failResult) + 1);
  }
  cases[0].name = "positive";
  cases[0].failMessageTemplate = "${reason}";
  cases[0].failResult = QP_TEST_RESULT_FAIL;
  cases[0].operands[0][0] = 5;
  cases[0].operands[0][1] = 0xc;
  cases[0].operands[0][2] = 0x11;
  cases[0].operands[1][0] = 5;
  cases[0].operands[1][1] = 5;
  cases[0].operands[1][2] = 7;
  cases[0].operands[2][0] = 0x4b;
  cases[0].operands[2][1] = 8;
  cases[0].operands[2][2] = 0x51;
  cases[0].operands[3][0] = 0x19;
  cases[0].operands[3][1] = 0x3c;
  cases[0].operands[3][2] = 100;
  cases[0].results[0][0] = 5;
  cases[0].results[0][1] = 0xc;
  cases[0].results[0][2] = 2;
  cases[0].results[1][0] = 0;
  cases[0].results[1][1] = 5;
  cases[0].results[1][2] = 2;
  cases[0].results[2][0] = 3;
  cases[0].results[2][1] = 8;
  cases[0].results[2][2] = 6;
  cases[0].results[3][0] = 0x19;
  cases[0].results[3][1] = 0x3c;
  cases[0].results[3][2] = 0;
  cases[1].name = "all";
  cases[1].failMessageTemplate = "Inconsistent results, but within specification: ${reason}";
  cases[1].failResult = negFailResult;
  cases[1].operands[2][2] = -0x51;
  cases[1].operands[3][0] = 0x19;
  cases[1].operands[3][1] = -0x3c;
  cases[1].operands[3][2] = 100;
  cases[1].operands[1][1] = -5;
  cases[1].operands[1][2] = 7;
  cases[1].operands[2][0] = 0x4b;
  cases[1].operands[2][1] = 8;
  cases[1].operands[0][0] = 5;
  cases[1].operands[0][1] = 0xc;
  cases[1].operands[0][2] = -0x11;
  cases[1].operands[1][0] = -5;
  cases[1].results[2][2] = -6;
  cases[1].results[3][0] = 0x19;
  cases[1].results[3][1] = -0x3c;
  cases[1].results[3][2] = 0;
  cases[1].results[1][1] = -5;
  cases[1].results[1][2] = 2;
  cases[1].results[2][0] = 3;
  cases[1].results[2][1] = 8;
  cases[1].results[0][0] = 5;
  cases[1].results[0][1] = 0xc;
  cases[1].results[0][2] = -2;
  cases[1].results[1][0] = 0;
  pCVar5 = cases;
  bVar2 = true;
  do {
    bVar4 = bVar2;
    inputColors[1].m_value =
         pCVar5->operands[1][2] << 0x10 ^ 0x800000U | 0xff000000 |
         pCVar5->operands[1][1] * 0x100 + 0x8000U | pCVar5->operands[1][0] + 0x80U;
    inputColors[0].m_value =
         pCVar5->operands[0][2] << 0x10 ^ 0x800000U | 0xff000000 |
         pCVar5->operands[0][1] * 0x100 + 0x8000U | pCVar5->operands[0][0] + 0x80U;
    inputColors[2].m_value =
         pCVar5->operands[2][2] << 0x10 ^ 0x800000U | 0xff000000 |
         pCVar5->operands[2][1] * 0x100 + 0x8000U | pCVar5->operands[2][0] + 0x80U;
    inputColors[3].m_value =
         pCVar5->operands[3][2] << 0x10 ^ 0x800000U | 0xff000000 |
         pCVar5->operands[3][1] * 0x100 + 0x8000U | pCVar5->operands[3][0] + 0x80U;
    outputColors[1].m_value =
         pCVar5->results[1][2] << 0x10 ^ 0x800000U | 0xff000000 |
         pCVar5->results[1][1] * 0x100 + 0x8000U | pCVar5->results[1][0] + 0x80U;
    outputColors[0].m_value =
         pCVar5->results[0][2] << 0x10 ^ 0x800000U | 0xff000000 |
         pCVar5->results[0][1] * 0x100 + 0x8000U | pCVar5->results[0][0] + 0x80U;
    outputColors[2].m_value =
         pCVar5->results[2][2] << 0x10 ^ 0x800000U | 0xff000000 |
         pCVar5->results[2][1] * 0x100 + 0x8000U | pCVar5->results[2][0] + 0x80U;
    outputColors[3].m_value =
         pCVar5->results[3][2] << 0x10 ^ 0x800000U | 0xff000000 |
         pCVar5->results[3][1] * 0x100 + 0x8000U | pCVar5->results[3][0] + 0x80U;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_198,((_Alloc_hider *)&pCVar5->name)->_M_p,&local_1e1);
    failResult = *(qpTestResult *)&pCVar5->failResult;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b8,pCVar5->failMessageTemplate,&local_1e2);
    local_1d8 = (undefined1  [16])0x0;
    local_1c8 = (pointer)0x0;
    createTestsForAllStages
              (&local_198,&inputColors,&outputColors,&fragments,
               (vector<int,_std::allocator<int>_> *)local_1d8,local_1e0,failResult,&local_1b8);
    if ((pointer)local_1d8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_1d8._0_8_,(long)local_1c8 - local_1d8._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
    }
    pCVar5 = cases + 1;
    bVar2 = false;
  } while (bVar4);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&fragments._M_t);
  return local_1e0;
}

Assistant:

tcu::TestCaseGroup* createOpSRemGraphicsTests(tcu::TestContext& testCtx, qpTestResult negFailResult)
{
	de::MovePtr<tcu::TestCaseGroup>		testGroup(new tcu::TestCaseGroup(testCtx, "srem", "OpSRem"));
	map<string, string>					fragments;

	fragments["pre_main"]				 =
		"%c_f32_255 = OpConstant %f32 255.0\n"
		"%c_i32_128 = OpConstant %i32 128\n"
		"%c_i32_255 = OpConstant %i32 255\n"
		"%c_v4f32_255 = OpConstantComposite %v4f32 %c_f32_255 %c_f32_255 %c_f32_255 %c_f32_255 \n"
		"%c_v4f32_0_5 = OpConstantComposite %v4f32 %c_f32_0_5 %c_f32_0_5 %c_f32_0_5 %c_f32_0_5 \n"
		"%c_v4i32_128 = OpConstantComposite %v4i32 %c_i32_128 %c_i32_128 %c_i32_128 %c_i32_128 \n";

	// The test does the following.
	// ivec4 ints = int(param1 * 255.0 + 0.5) - 128;
	// ivec4 result = ivec4(srem(ints.x, ints.y), srem(ints.y, ints.z), srem(ints.z, ints.x), 255);
	// return float(result + 128) / 255.0;
	fragments["testfun"]				 =
		"%test_code = OpFunction %v4f32 None %v4f32_function\n"
		"%param1 = OpFunctionParameter %v4f32\n"
		"%label_testfun = OpLabel\n"
		"%div255 = OpFMul %v4f32 %param1 %c_v4f32_255\n"
		"%add0_5 = OpFAdd %v4f32 %div255 %c_v4f32_0_5\n"
		"%uints_in = OpConvertFToS %v4i32 %add0_5\n"
		"%ints_in = OpISub %v4i32 %uints_in %c_v4i32_128\n"
		"%x_in = OpCompositeExtract %i32 %ints_in 0\n"
		"%y_in = OpCompositeExtract %i32 %ints_in 1\n"
		"%z_in = OpCompositeExtract %i32 %ints_in 2\n"
		"%x_out = OpSRem %i32 %x_in %y_in\n"
		"%y_out = OpSRem %i32 %y_in %z_in\n"
		"%z_out = OpSRem %i32 %z_in %x_in\n"
		"%ints_out = OpCompositeConstruct %v4i32 %x_out %y_out %z_out %c_i32_255\n"
		"%ints_offset = OpIAdd %v4i32 %ints_out %c_v4i32_128\n"
		"%f_ints_offset = OpConvertSToF %v4f32 %ints_offset\n"
		"%float_out = OpFDiv %v4f32 %f_ints_offset %c_v4f32_255\n"
		"OpReturnValue %float_out\n"
		"OpFunctionEnd\n";

	const struct CaseParams
	{
		const char*		name;
		const char*		failMessageTemplate;	// customized status message
		qpTestResult	failResult;				// override status on failure
		int				operands[4][3];			// four (x, y, z) vectors of operands
		int				results[4][3];			// four (x, y, z) vectors of results
	} cases[] =
	{
		{
			"positive",
			"${reason}",
			QP_TEST_RESULT_FAIL,
			{ { 5, 12, 17 }, { 5, 5, 7 }, { 75, 8, 81 }, { 25, 60, 100 } },			// operands
			{ { 5, 12,  2 }, { 0, 5, 2 }, {  3, 8,  6 }, { 25, 60,   0 } },			// results
		},
		{
			"all",
			"Inconsistent results, but within specification: ${reason}",
			negFailResult,															// negative operands, not required by the spec
			{ { 5, 12, -17 }, { -5, -5, 7 }, { 75, 8, -81 }, { 25, -60, 100 } },	// operands
			{ { 5, 12,  -2 }, {  0, -5, 2 }, {  3, 8,  -6 }, { 25, -60,   0 } },	// results
		},
	};
	// If either operand is negative the result is undefined. Some implementations may still return correct values.

	for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(cases); ++caseNdx)
	{
		const CaseParams&	params			= cases[caseNdx];
		RGBA				inputColors[4];
		RGBA				outputColors[4];

		for (int i = 0; i < 4; ++i)
		{
			inputColors [i] = RGBA(params.operands[i][0] + 128, params.operands[i][1] + 128, params.operands[i][2] + 128, 255);
			outputColors[i] = RGBA(params.results [i][0] + 128, params.results [i][1] + 128, params.results [i][2] + 128, 255);
		}

		createTestsForAllStages(params.name, inputColors, outputColors, fragments, testGroup.get(), params.failResult, params.failMessageTemplate);
	}

	return testGroup.release();
}